

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

namespace_t * __thiscall
cfgfile::generator::cfg::namespace_t::operator=(namespace_t *this,namespace_t *other)

{
  string *psVar1;
  longlong lVar2;
  namespace_t *in_RSI;
  namespace_t *in_RDI;
  vector<cfgfile::generator::cfg::class_t,_std::allocator<cfgfile::generator::cfg::class_t>_>
  *in_stack_00000088;
  vector<cfgfile::generator::cfg::class_t,_std::allocator<cfgfile::generator::cfg::class_t>_>
  *in_stack_00000090;
  
  if (in_RDI != in_RSI) {
    psVar1 = name_abi_cxx11_(in_RSI);
    std::__cxx11::string::operator=((string *)in_RDI,(string *)psVar1);
    all_nested(in_RSI);
    std::
    vector<cfgfile::generator::cfg::namespace_t,_std::allocator<cfgfile::generator::cfg::namespace_t>_>
    ::operator=((vector<cfgfile::generator::cfg::namespace_t,_std::allocator<cfgfile::generator::cfg::namespace_t>_>
                 *)in_stack_00000090,
                (vector<cfgfile::generator::cfg::namespace_t,_std::allocator<cfgfile::generator::cfg::namespace_t>_>
                 *)in_stack_00000088);
    classes(in_RSI);
    std::vector<cfgfile::generator::cfg::class_t,_std::allocator<cfgfile::generator::cfg::class_t>_>
    ::operator=(in_stack_00000090,in_stack_00000088);
    lVar2 = line_number(in_RSI);
    in_RDI->m_line_number = lVar2;
    lVar2 = column_number(in_RSI);
    in_RDI->m_column_number = lVar2;
    in_RDI->m_parent = (namespace_t *)0x0;
  }
  return in_RDI;
}

Assistant:

namespace_t &
namespace_t::operator = ( const namespace_t & other )
{
	if( this != &other )
	{
		m_name = other.name();
		m_nested_namespaces = other.all_nested();
		m_classes = other.classes();
		m_line_number = other.line_number();
		m_column_number = other.column_number();
		m_parent = nullptr;
	}

	return *this;
}